

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* Gudhi::Persistence_representations::create_Gaussian_filter
            (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *__return_storage_ptr__,size_t pixel_radius,double sigma)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  reference pvVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_type local_c0;
  size_t j_1;
  size_t i_2;
  size_t j;
  size_t i_1;
  double real_y;
  double real_x;
  int local_88;
  int y;
  int x;
  undefined1 local_78 [8];
  vector<double,_std::allocator<double>_> v;
  size_t i;
  allocator<std::vector<double,_std::allocator<double>_>_> local_42;
  undefined1 local_41;
  double local_40;
  double sum;
  double sigma_sqr;
  double r;
  double dStack_20;
  bool dbg;
  double sigma_local;
  size_t pixel_radius_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *kernel;
  undefined4 uVar13;
  
  r._7_1_ = 0;
  sigma_sqr = 0.0;
  sum = sigma * sigma;
  local_40 = 0.0;
  local_41 = 0;
  dStack_20 = sigma;
  sigma_local = (double)pixel_radius;
  pixel_radius_local = (size_t)__return_storage_ptr__;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_42);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,pixel_radius * 2 + 1,&local_42);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_42);
  for (v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      pdVar2 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage,
      pdVar3 = (pointer)std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::size(__return_storage_ptr__), pdVar2 != pdVar3;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    lVar1 = (long)sigma_local * 2;
    _x = 0.0;
    std::allocator<double>::allocator((allocator<double> *)((long)&y + 3));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_78,lVar1 + 1,
               (value_type_conflict1 *)&x,(allocator<double> *)((long)&y + 3));
    std::allocator<double>::~allocator((allocator<double> *)((long)&y + 3));
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](__return_storage_ptr__,
                          (size_type)
                          v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::operator=
              (pvVar4,(vector<double,_std::allocator<double>_> *)local_78);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_78);
  }
  if ((r._7_1_ & 1) != 0) {
    std::operator<<((ostream *)&std::clog,"Kernel initialize \n");
    poVar5 = std::operator<<((ostream *)&std::clog,"pixel_radius : ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)sigma_local);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::clog,"kernel.size() : ");
    sVar6 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(__return_storage_ptr__);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    getchar();
  }
  for (local_88 = -SUB84(sigma_local,0); local_88 <= SUB84(sigma_local,0); local_88 = local_88 + 1)
  {
    for (real_x._4_4_ = -SUB84(sigma_local,0); iVar8 = SUB84(sigma_local,0), real_x._4_4_ <= iVar8;
        real_x._4_4_ = real_x._4_4_ + 1) {
      uVar13 = (undefined4)((ulong)sigma_local >> 0x20);
      auVar11._8_4_ = uVar13;
      auVar11._0_8_ = sigma_local;
      auVar11._12_4_ = 0x45300000;
      dVar9 = ((dStack_20 + dStack_20) * (double)local_88) /
              ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0));
      auVar12._8_4_ = uVar13;
      auVar12._0_8_ = sigma_local;
      auVar12._12_4_ = 0x45300000;
      dVar10 = ((dStack_20 + dStack_20) * (double)real_x._4_4_) /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0));
      sigma_sqr = sqrt(dVar9 * dVar9 + dVar10 * dVar10);
      dVar9 = exp(-(sigma_sqr * sigma_sqr) / sum);
      dVar10 = sum * 3.141592;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](__return_storage_ptr__,(long)local_88 + (long)sigma_local);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar4,(long)real_x._4_4_ + (long)sigma_local);
      *pvVar7 = dVar9 / dVar10;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](__return_storage_ptr__,(long)local_88 + (long)sigma_local);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar4,(long)real_x._4_4_ + (long)sigma_local);
      local_40 = *pvVar7 + local_40;
    }
  }
  for (j = 0; sVar6 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::size(__return_storage_ptr__), j != sVar6; j = j + 1) {
    i_2 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](__return_storage_ptr__,j);
      sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
      dVar9 = local_40;
      if (i_2 == sVar6) break;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](__return_storage_ptr__,j);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,i_2);
      *pvVar7 = *pvVar7 / dVar9;
      i_2 = i_2 + 1;
    }
  }
  if ((r._7_1_ & 1) != 0) {
    std::operator<<((ostream *)&std::clog,"Here is the kernel : \n");
    for (j_1 = 0; sVar6 = std::
                          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ::size(__return_storage_ptr__), j_1 != sVar6; j_1 = j_1 + 1) {
      local_c0 = 0;
      while( true ) {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,j_1);
        sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
        if (local_c0 == sVar6) break;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,j_1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,local_c0);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,*pvVar7);
        std::operator<<(poVar5," ");
        local_c0 = local_c0 + 1;
      }
      std::ostream::operator<<((ostream *)&std::clog,std::endl<char,std::char_traits<char>>);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double> > create_Gaussian_filter(size_t pixel_radius, double sigma) {
  bool dbg = false;
  // we are computing the kernel mask to 2 standard deviations away from the center. We discretize it in a grid of a
  // size 2*pixel_radius times 2*pixel_radius.

  double r = 0;
  double sigma_sqr = sigma * sigma;

  // sum is for normalization
  double sum = 0;

  // initialization of a kernel:
  std::vector<std::vector<double> > kernel(2 * pixel_radius + 1);
  for (size_t i = 0; i != kernel.size(); ++i) {
    std::vector<double> v(2 * pixel_radius + 1, 0);
    kernel[i] = v;
  }

  if (dbg) {
    std::clog << "Kernel initialize \n";
    std::clog << "pixel_radius : " << pixel_radius << std::endl;
    std::clog << "kernel.size() : " << kernel.size() << std::endl;
    getchar();
  }

  for (int x = -pixel_radius; x <= static_cast<int>(pixel_radius); x++) {
    for (int y = -pixel_radius; y <= static_cast<int>(pixel_radius); y++) {
      double real_x = 2 * sigma * x / pixel_radius;
      double real_y = 2 * sigma * y / pixel_radius;
      r = std::sqrt(real_x * real_x + real_y * real_y);
      kernel[x + pixel_radius][y + pixel_radius] = (exp(-(r * r) / sigma_sqr)) / (3.141592 * sigma_sqr);
      sum += kernel[x + pixel_radius][y + pixel_radius];
    }
  }

  // normalize the kernel
  for (size_t i = 0; i != kernel.size(); ++i) {
    for (size_t j = 0; j != kernel[i].size(); ++j) {
      kernel[i][j] /= sum;
    }
  }

  if (dbg) {
    std::clog << "Here is the kernel : \n";
    for (size_t i = 0; i != kernel.size(); ++i) {
      for (size_t j = 0; j != kernel[i].size(); ++j) {
        std::clog << kernel[i][j] << " ";
      }
      std::clog << std::endl;
    }
  }
  return kernel;
}